

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

Status leveldb::anon_unknown_1::PosixError(string *context,int error_number)

{
  long lVar1;
  int in_EDX;
  Slice *in_RDI;
  long in_FS_OFFSET;
  Slice *in_stack_ffffffffffffff88;
  Slice *pSVar2;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pSVar2 = in_RDI;
  if (in_EDX == 2) {
    Slice::Slice(in_RDI,(string *)in_RDI);
    strerror(2);
    Slice::Slice(pSVar2,(char *)in_RDI);
    Status::NotFound(in_RDI,in_stack_ffffffffffffff88);
  }
  else {
    Slice::Slice(in_RDI,(string *)in_RDI);
    strerror(in_EDX);
    Slice::Slice(pSVar2,(char *)in_RDI);
    Status::IOError(in_RDI,in_stack_ffffffffffffff88);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (Status)(char *)pSVar2;
  }
  __stack_chk_fail();
}

Assistant:

Status PosixError(const std::string& context, int error_number) {
  if (error_number == ENOENT) {
    return Status::NotFound(context, std::strerror(error_number));
  } else {
    return Status::IOError(context, std::strerror(error_number));
  }
}